

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList(ImDrawList *draw_list,char *label)

{
  bool bVar1;
  int iVar2;
  ImDrawList *pIVar3;
  iterator pvVar4;
  value_type *rhs;
  char *pcVar5;
  char *local_2b0;
  uint local_294;
  ImVec2 *local_278;
  uint local_26c;
  long local_258;
  char *local_238;
  ImVec2 local_220;
  value_type *local_218;
  ImDrawVert *v;
  int n;
  ImVec2 triangles_pos [3];
  char *buf_p;
  char buf [300];
  uint local_b4;
  int local_b0;
  int vtx_i;
  int prim;
  undefined1 local_a0 [8];
  ImGuiListClipper clipper;
  int i;
  ImRect vtxs_rect;
  ImRect clip_rect;
  bool pcmd_node_open;
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  int elem_offset;
  ImDrawList *overlay_draw_list;
  ImVec4 local_2c;
  byte local_19;
  char *pcStack_18;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_238 = "";
  }
  else {
    local_238 = draw_list->_OwnerName;
  }
  pcStack_18 = label;
  label_local = (char *)draw_list;
  local_19 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_238,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar5 = label_local;
  pIVar3 = GetWindowDrawList();
  if ((ImDrawList *)pcVar5 == pIVar3) {
    SameLine(0.0,-1.0);
    ImColor::ImColor((ImColor *)((long)&overlay_draw_list + 4),0xff,100,100,0xff);
    local_2c = ImColor::operator_cast_to_ImVec4((ImColor *)((long)&overlay_draw_list + 4));
    TextColored(&local_2c,"CURRENTLY APPENDING");
    if ((local_19 & 1) != 0) {
      TreePop();
    }
  }
  else if ((local_19 & 1) != 0) {
    pIVar3 = &GImGui->OverlayDrawList;
    ImDrawList::PushClipRectFullScreen(pIVar3);
    pcmd._4_4_ = 0;
    for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
        pvVar4 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pvVar4;
        idx_buffer = idx_buffer + 0x18) {
      if (*(long *)(idx_buffer + 0x10) == 0) {
        if (*(int *)(label_local + 0x10) < 1) {
          local_258 = 0;
        }
        else {
          local_258 = *(long *)(label_local + 0x18);
        }
        stack0xffffffffffffffa0 = local_258;
        pvVar4 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
        pcVar5 = "non-indexed";
        if (0 < *(int *)(label_local + 0x10)) {
          pcVar5 = "indexed";
        }
        clip_rect.Max.x._3_1_ =
             TreeNode((void *)(((long)idx_buffer - (long)pvVar4) / 0x30),
                      "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)",
                      (double)*(float *)(idx_buffer + 2),(double)*(float *)(idx_buffer + 4),
                      (double)*(float *)(idx_buffer + 6),(double)*(float *)(idx_buffer + 8),
                      (ulong)*(uint *)idx_buffer,pcVar5,*(undefined8 *)(idx_buffer + 0xc));
        if (((show_clip_rects & 1U) != 0) && (bVar1 = IsItemHovered(), bVar1)) {
          ImRect::ImRect((ImRect *)&vtxs_rect.Max,(ImVec4 *)(idx_buffer + 2));
          ImRect::ImRect((ImRect *)&clipper.DisplayEnd);
          for (clipper.DisplayStart = pcmd._4_4_;
              clipper.DisplayStart < pcmd._4_4_ + *(int *)idx_buffer;
              clipper.DisplayStart = clipper.DisplayStart + 1) {
            if (stack0xffffffffffffffa0 == 0) {
              local_26c = clipper.DisplayStart;
            }
            else {
              local_26c = (uint)*(ushort *)
                                 (stack0xffffffffffffffa0 + (long)clipper.DisplayStart * 2);
            }
            rhs = ImVector<ImDrawVert>::operator[]
                            ((ImVector<ImDrawVert> *)(label_local + 0x20),local_26c);
            ImRect::Add((ImRect *)&clipper.DisplayEnd,&rhs->pos);
          }
          ImRect::Floor((ImRect *)&vtxs_rect.Max);
          ImDrawList::AddRect(pIVar3,&vtxs_rect.Max,&clip_rect.Min,0xff00ffff,0.0,0xf,1.0);
          ImRect::Floor((ImRect *)&clipper.DisplayEnd);
          ImDrawList::AddRect(pIVar3,(ImVec2 *)&clipper.DisplayEnd,&vtxs_rect.Min,0xffff00ff,0.0,0xf
                              ,1.0);
        }
        if ((clip_rect.Max.x._3_1_ & 1) != 0) {
          ImGuiListClipper::ImGuiListClipper
                    ((ImGuiListClipper *)local_a0,*(uint *)idx_buffer / 3,-1.0);
          while (bVar1 = ImGuiListClipper::Step((ImGuiListClipper *)local_a0), bVar1) {
            local_b4 = pcmd._4_4_ + clipper.ItemsCount * 3;
            for (local_b0 = clipper.ItemsCount; local_b0 < clipper.StepNo; local_b0 = local_b0 + 1)
            {
              triangles_pos[2] = (ImVec2)&buf_p;
              local_278 = (ImVec2 *)&stack0xfffffffffffffdf8;
              do {
                ImVec2::ImVec2(local_278);
                local_278 = local_278 + 1;
              } while (local_278 != triangles_pos + 2);
              for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                if (stack0xffffffffffffffa0 == 0) {
                  local_294 = local_b4;
                }
                else {
                  local_294 = (uint)*(ushort *)(stack0xffffffffffffffa0 + (long)(int)local_b4 * 2);
                }
                local_218 = ImVector<ImDrawVert>::operator[]
                                      ((ImVector<ImDrawVert> *)(label_local + 0x20),local_294);
                *(ImVec2 *)(&stack0xfffffffffffffdf8 + (long)v._4_4_ * 8) = local_218->pos;
                if (v._4_4_ == 0) {
                  local_2b0 = "vtx";
                }
                else {
                  local_2b0 = "   ";
                }
                iVar2 = sprintf((char *)triangles_pos[2],
                                "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n",
                                (double)(local_218->pos).x,(double)(local_218->pos).y,
                                (double)(local_218->uv).x,(double)(local_218->uv).y,local_2b0,
                                (ulong)local_b4,(ulong)local_218->col);
                triangles_pos[2] = (ImVec2)((long)triangles_pos[2] + (long)iVar2);
                local_b4 = local_b4 + 1;
              }
              ImVec2::ImVec2(&local_220,0.0,0.0);
              Selectable((char *)&buf_p,false,0,&local_220);
              bVar1 = IsItemHovered();
              if (bVar1) {
                ImDrawList::AddPolyline
                          (pIVar3,(ImVec2 *)&stack0xfffffffffffffdf8,3,0xff00ffff,true,1.0,false);
              }
            }
          }
          TreePop();
          ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_a0);
        }
      }
      else {
        BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x10),
                   *(undefined8 *)(idx_buffer + 0x14));
      }
      pcmd._4_4_ = *(int *)idx_buffer + pcmd._4_4_;
    }
    ImDrawList::PopClipRect(pIVar3);
    TreePop();
  }
  return;
}

Assistant:

static void NodeDrawList(ImDrawList* draw_list, const char* label)
            {
                bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
                if (draw_list == ImGui::GetWindowDrawList())
                {
                    ImGui::SameLine();
                    ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                    if (node_open) ImGui::TreePop();
                    return;
                }
                if (!node_open)
                    return;

                ImDrawList* overlay_draw_list = &GImGui->OverlayDrawList;   // Render additional visuals into the top-most draw list
                overlay_draw_list->PushClipRectFullScreen();
                int elem_offset = 0;
                for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
                {
                    if (pcmd->UserCallback)
                    {
                        ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                        continue;
                    }
                    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                    bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %-4d %s vtx, tex = %p, clip_rect = (%.0f,%.0f)..(%.0f,%.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                    if (show_clip_rects && ImGui::IsItemHovered())
                    {
                        ImRect clip_rect = pcmd->ClipRect;
                        ImRect vtxs_rect;
                        for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                            vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                        clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                        vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                    }
                    if (!pcmd_node_open)
                        continue;
                    ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                    while (clipper.Step())
                        for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                        {
                            char buf[300], *buf_p = buf;
                            ImVec2 triangles_pos[3];
                            for (int n = 0; n < 3; n++, vtx_i++)
                            {
                                ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                                triangles_pos[n] = v.pos;
                                buf_p += sprintf(buf_p, "%s %04d { pos = (%8.2f,%8.2f), uv = (%.6f,%.6f), col = %08X }\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                            }
                            ImGui::Selectable(buf, false);
                            if (ImGui::IsItemHovered())
                                overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f, false);  // Add triangle without AA, more readable for large-thin triangle
                        }
                    ImGui::TreePop();
                }
                overlay_draw_list->PopClipRect();
                ImGui::TreePop();
            }